

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<Js::EvalMapStringInternal<false>,Js::FunctionInfo*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::TryGetValue<Js::EvalMapStringInternal<false>>
          (BaseDictionary<Js::EvalMapStringInternal<false>,Js::FunctionInfo*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,EvalMapStringInternal<false> *key,FunctionInfo **value)

{
  long lVar1;
  bool bVar2;
  hash_t hVar3;
  DictionaryStats *this_00;
  uint uVar4;
  uint depth;
  
  lVar1 = *(long *)this;
  depth = 0;
  if (lVar1 != 0) {
    hVar3 = PrimePolicy::ModPrime(key->hash >> 1,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar4 = *(uint *)(lVar1 + (ulong)hVar3 * 4);
    depth = 0;
    if (-1 < (int)uVar4) {
      lVar1 = *(long *)(this + 8);
      depth = 0;
      do {
        bVar2 = Js::EvalMapStringInternal<false>::operator==
                          ((EvalMapStringInternal<false> *)(lVar1 + (ulong)uVar4 * 0x38 + 0x10),key)
        ;
        if (bVar2) {
          this_00 = *(DictionaryStats **)(this + 0x30);
          goto LAB_007a724c;
        }
        depth = depth + 1;
        uVar4 = *(uint *)((ulong)uVar4 * 0x38 + lVar1 + 8);
      } while (-1 < (int)uVar4);
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  uVar4 = 0xffffffff;
LAB_007a724c:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,depth);
  }
  if (-1 < (int)uVar4) {
    *value = *(FunctionInfo **)(*(long *)(this + 8) + (ulong)uVar4 * 0x38);
  }
  return -1 < (int)uVar4;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }